

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileOptions::SerializeWithCachedSizesToArray(FileOptions *this,uint8 *target)

{
  bool bVar1;
  FileOptions_OptimizeMode value;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  string *psVar5;
  UninterpretedOption *this_00;
  uint8 *puVar6;
  UnknownFieldSet *pUVar7;
  int local_2cc;
  byte *pbStack_2c8;
  int i;
  uint8 *target_local;
  FileOptions *this_local;
  byte *local_e8;
  byte *local_d0;
  uint8 *local_b8;
  byte *local_a0;
  byte *local_88;
  byte *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_java_package(this);
  pbStack_2c8 = target;
  if (bVar1) {
    java_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = java_package_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_b8 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_b8 = target + 2;
    }
    else {
      local_b8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_b8);
    pbStack_2c8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_java_outer_classname(this);
  if (bVar1) {
    java_outer_classname_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_outer_classname_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = java_outer_classname_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_d0 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_d0 = pbStack_2c8 + 2;
    }
    else {
      local_d0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_d0);
    pbStack_2c8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_optimize_for(this);
  if (bVar1) {
    value = optimize_for(this);
    uVar3 = internal::WireFormatLite::MakeTag(9,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_a0 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_a0 = pbStack_2c8 + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_a0);
  }
  bVar1 = has_java_multiple_files(this);
  if (bVar1) {
    bVar1 = java_multiple_files(this);
    uVar3 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_28 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_28 = pbStack_2c8 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_28);
  }
  bVar1 = has_go_package(this);
  if (bVar1) {
    go_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    go_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = go_package_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(0xb,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_e8 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_e8 = pbStack_2c8 + 2;
    }
    else {
      local_e8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_e8);
    pbStack_2c8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_cc_generic_services(this);
  if (bVar1) {
    bVar1 = cc_generic_services(this);
    uVar3 = internal::WireFormatLite::MakeTag(0x10,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_40 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_40 = pbStack_2c8 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_40);
  }
  bVar1 = has_java_generic_services(this);
  if (bVar1) {
    bVar1 = java_generic_services(this);
    uVar3 = internal::WireFormatLite::MakeTag(0x11,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_58 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_58 = pbStack_2c8 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_58);
  }
  bVar1 = has_py_generic_services(this);
  if (bVar1) {
    bVar1 = py_generic_services(this);
    uVar3 = internal::WireFormatLite::MakeTag(0x12,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_70 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_70 = pbStack_2c8 + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_70);
  }
  bVar1 = has_java_generate_equals_and_hash(this);
  if (bVar1) {
    bVar1 = java_generate_equals_and_hash(this);
    uVar3 = internal::WireFormatLite::MakeTag(0x14,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_88 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_88 = pbStack_2c8 + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    pbStack_2c8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_88);
  }
  for (local_2cc = 0; iVar2 = uninterpreted_option_size(this), local_2cc < iVar2;
      local_2cc = local_2cc + 1) {
    this_00 = uninterpreted_option(this,local_2cc);
    uVar3 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_2c8 = (byte)uVar3;
      local_10 = pbStack_2c8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_2c8 = (byte)uVar3 | 0x80;
      pbStack_2c8[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_2c8 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_2c8);
    }
    uVar3 = UninterpretedOption::GetCachedSize(this_00);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_2c8 = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pbStack_2c8 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                          (&this->_extensions_,1000,0x20000000,pbStack_2c8);
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    pbStack_2c8 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar7,pbStack_2c8);
  }
  return pbStack_2c8;
}

Assistant:

::google::protobuf::uint8* FileOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string java_package = 1;
  if (has_java_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (has_java_outer_classname()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (has_optimize_for()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      9, this->optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (has_java_multiple_files()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (has_go_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (has_cc_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (has_java_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (has_py_generic_services()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(18, this->py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [default = false];
  if (has_java_generate_equals_and_hash()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(20, this->java_generate_equals_and_hash(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}